

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToStringVisitor.cpp
# Opt level: O2

void __thiscall binlog::ToStringVisitor::visit(ToStringVisitor *this,Enum e)

{
  OstreamBuffer *this_00;
  size_t in_RCX;
  int __fd;
  
  comma(this);
  if (e.enumerator._len == 0) {
    this_00 = detail::OstreamBuffer::operator<<(this->_out,"0x");
    __fd = (int)e.value._ptr;
    e.enumerator._len = e.value._len;
  }
  else {
    this_00 = this->_out;
    __fd = (int)e.enumerator._ptr;
  }
  detail::OstreamBuffer::write(this_00,__fd,(void *)e.enumerator._len,in_RCX);
  return;
}

Assistant:

void ToStringVisitor::visit(mserialize::Visitor::Enum e)
{
  comma();
  if (e.enumerator.empty())
  {
    _out << "0x" << e.value;
  }
  else
  {
    _out << e.enumerator;
  }
}